

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3243:36)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3243:36)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long *plVar3;
  ulong *puVar4;
  ulong *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_c8;
  ulong *local_a8;
  undefined8 local_a0;
  ulong local_98;
  long lStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  uint *local_38 [2];
  
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_assign((string *)&local_c8);
  local_60 = 0;
  local_68 = &PTR__BasicResult_001b1540;
  local_50 = 0;
  local_48 = 0;
  local_58 = &local_48;
  parseUInt((Catch *)local_38,&local_c8,10);
  if (local_38[0] == (uint *)0x0) {
    std::operator+(&local_88,"Could not parse \'",&local_c8);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_a8 = &local_98;
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_98 = *puVar5;
      lStack_90 = plVar3[3];
      puVar4 = local_a8;
    }
    else {
      local_98 = *puVar5;
      puVar4 = (ulong *)*plVar3;
    }
    sVar2 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (puVar4 == local_a8) {
      paVar1->_M_allocated_capacity = local_98;
      *(long *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = lStack_90;
    }
    else {
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)puVar4;
      (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_98;
    }
    (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar2;
    local_a0 = 0;
    local_98 = local_98 & 0xffffffffffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ((this->m_lambda).config)->shardIndex = *local_38[0];
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  local_68 = &PTR__BasicResult_001b1540;
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }